

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O1

void __thiscall wasm::PrintSExpression::PrintSExpression(PrintSExpression *this,ostream *o)

{
  bool bVar1;
  
  this->o = o;
  this->indent = 0;
  this->full = false;
  (this->moduleStackIR).super__Optional_base<wasm::ModuleStackIR,_false,_false>._M_payload.
  super__Optional_payload<wasm::ModuleStackIR,_true,_false,_false>.
  super__Optional_payload_base<wasm::ModuleStackIR>._M_engaged = false;
  (this->lastPrintedLocation).super__Optional_base<wasm::Function::DebugLocation,_true,_true>.
  _M_payload.super__Optional_payload_base<wasm::Function::DebugLocation>._M_engaged = false;
  this->currModule = (Module *)0x0;
  this->currFunction = (Function *)0x0;
  *(undefined8 *)&this->controlFlowDepth = 0;
  *(undefined8 *)
   ((long)&(this->heapTypes).super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
           _M_impl.super__Vector_impl_data._M_start + 4) = 0;
  (this->heapTypes).super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->heapTypes).super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->signatureTypes)._M_h._M_buckets = &(this->signatureTypes)._M_h._M_single_bucket;
  (this->signatureTypes)._M_h._M_bucket_count = 1;
  (this->signatureTypes)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->signatureTypes)._M_h._M_element_count = 0;
  (this->signatureTypes)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->signatureTypes)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->signatureTypes)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  this->lastPrintIndent = 0;
  TypePrinter::TypePrinter(&this->typePrinter,this,&this->heapTypes);
  this->minify = false;
  this->maybeSpace = " ";
  this->maybeNewLine = "\n";
  if (this->full == false) {
    bVar1 = anon_unknown_0::isFullForced();
    this->full = bVar1;
  }
  return;
}

Assistant:

PrintSExpression(std::ostream& o) : o(o), typePrinter(*this, heapTypes) {
    setMinify(false);
    if (!full) {
      full = isFullForced();
    }
  }